

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O2

void __thiscall
charls::
jls_codec<charls::default_traits<unsigned_char,_charls::triplet<unsigned_char>_>,_charls::decoder_strategy>
::do_line(jls_codec<charls::default_traits<unsigned_char,_charls::triplet<unsigned_char>_>,_charls::decoder_strategy>
          *this,triplet<unsigned_char> *param_1)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  pixel_type *ppVar9;
  pixel_type *ppVar10;
  sample_type sVar11;
  sample_type sVar12;
  sample_type sVar13;
  uint rb;
  int32_t iVar14;
  int32_t iVar15;
  int32_t iVar16;
  uint start_index;
  uint rc;
  uint rc_00;
  uint uVar17;
  int iVar18;
  int qs;
  int qs_00;
  
  start_index = 0;
  while (start_index < this->width_) {
    ppVar9 = this->previous_line_;
    ppVar10 = this->current_line_;
    iVar18 = start_index - 1;
    bVar1 = ppVar10[iVar18].field_0.v1;
    bVar2 = ppVar10[iVar18].field_1.v2;
    bVar3 = ppVar10[iVar18].field_2.v3;
    bVar4 = ppVar9[iVar18].field_0.v1;
    rc = (uint)ppVar9[iVar18].field_1.v2;
    rc_00 = (uint)ppVar9[iVar18].field_2.v3;
    bVar5 = ppVar9[(int)start_index].field_0.v1;
    bVar6 = ppVar9[(int)start_index].field_1.v2;
    uVar17 = start_index + 1;
    bVar7 = ppVar9[(int)uVar17].field_1.v2;
    bVar8 = ppVar9[(int)uVar17].field_2.v3;
    rb = (uint)ppVar9[(int)start_index].field_2.v3;
    iVar14 = quantize_gradient(this,(uint)ppVar9[(int)uVar17].field_0.v1 - (uint)bVar5);
    iVar15 = quantize_gradient(this,(uint)bVar5 - (uint)bVar4);
    iVar16 = quantize_gradient(this,(uint)bVar4 - (uint)bVar1);
    iVar18 = (iVar14 * 9 + iVar15) * 9 + iVar16;
    iVar14 = quantize_gradient(this,(uint)bVar7 - (uint)bVar6);
    iVar15 = quantize_gradient(this,bVar6 - rc);
    iVar16 = quantize_gradient(this,rc - bVar2);
    qs = (iVar14 * 9 + iVar15) * 9 + iVar16;
    iVar14 = quantize_gradient(this,bVar8 - rb);
    iVar15 = quantize_gradient(this,rb - rc_00);
    iVar16 = quantize_gradient(this,rc_00 - bVar3);
    qs_00 = (iVar14 * 9 + iVar15) * 9 + iVar16;
    if ((qs == 0 && iVar18 == 0) && qs_00 == 0) {
      iVar14 = do_run_mode(this,start_index,(decoder_strategy *)0x0);
      start_index = iVar14 + start_index;
    }
    else {
      bVar7 = this->current_line_[(int)start_index].field_0.v1;
      iVar14 = get_predicted_value((uint)bVar1,(uint)bVar5,(uint)bVar4);
      sVar11 = do_regular(this,iVar18,(uint)bVar7,iVar14,(decoder_strategy *)0x0);
      bVar1 = this->current_line_[(int)start_index].field_1.v2;
      iVar14 = get_predicted_value((uint)bVar2,(uint)bVar6,rc);
      sVar12 = do_regular(this,qs,(uint)bVar1,iVar14,(decoder_strategy *)0x0);
      bVar1 = this->current_line_[(int)start_index].field_2.v3;
      iVar14 = get_predicted_value((uint)bVar3,rb,rc_00);
      sVar13 = do_regular(this,qs_00,(uint)bVar1,iVar14,(decoder_strategy *)0x0);
      ppVar9 = this->current_line_;
      ppVar9[(int)start_index].field_0.v1 = sVar11;
      ppVar9[(int)start_index].field_1.v2 = sVar12;
      ppVar9[(int)start_index].field_2.v3 = sVar13;
      start_index = uVar17;
    }
  }
  return;
}

Assistant:

void do_line(triplet<sample_type>* /*template_selector*/)
    {
        int32_t index{};
        while (static_cast<uint32_t>(index) < width_)
        {
            const triplet<sample_type> ra{current_line_[index - 1]};
            const triplet<sample_type> rc{previous_line_[index - 1]};
            const triplet<sample_type> rb{previous_line_[index]};
            const triplet<sample_type> rd{previous_line_[index + 1]};

            const int32_t qs1{compute_context_id(quantize_gradient(rd.v1 - rb.v1), quantize_gradient(rb.v1 - rc.v1),
                                                 quantize_gradient(rc.v1 - ra.v1))};
            const int32_t qs2{compute_context_id(quantize_gradient(rd.v2 - rb.v2), quantize_gradient(rb.v2 - rc.v2),
                                                 quantize_gradient(rc.v2 - ra.v2))};
            const int32_t qs3{compute_context_id(quantize_gradient(rd.v3 - rb.v3), quantize_gradient(rb.v3 - rc.v3),
                                                 quantize_gradient(rc.v3 - ra.v3))};

            if (qs1 == 0 && qs2 == 0 && qs3 == 0)
            {
                index += do_run_mode(index, static_cast<Strategy*>(nullptr));
            }
            else
            {
                triplet<sample_type> rx;
                rx.v1 = do_regular(qs1, current_line_[index].v1, get_predicted_value(ra.v1, rb.v1, rc.v1),
                                   static_cast<Strategy*>(nullptr));
                rx.v2 = do_regular(qs2, current_line_[index].v2, get_predicted_value(ra.v2, rb.v2, rc.v2),
                                   static_cast<Strategy*>(nullptr));
                rx.v3 = do_regular(qs3, current_line_[index].v3, get_predicted_value(ra.v3, rb.v3, rc.v3),
                                   static_cast<Strategy*>(nullptr));
                current_line_[index] = rx;
                ++index;
            }
        }
    }